

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::addEquation(Parser *this,Token *startToken,Identifier *name,string *value)

{
  bool bVar1;
  TokenizerPosition start_00;
  Token *pTVar2;
  Identifier *this_00;
  size_t referenceIndex;
  reference pFVar3;
  bool bVar4;
  FileEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_> *__range1;
  size_t index;
  undefined1 local_470 [8];
  vector<Token,_std::allocator<Token>_> tokens;
  TokenizerPosition end;
  Token *token;
  TokenizerPosition start;
  FileTokenizer tok;
  undefined1 local_2f0 [8];
  TextFile f;
  string *value_local;
  Identifier *name_local;
  Token *startToken_local;
  Parser *this_local;
  
  f.bufPos = (size_t)value;
  TextFile::TextFile((TextFile *)local_2f0);
  TextFile::openMemory((TextFile *)local_2f0,(string *)f.bufPos);
  FileTokenizer::FileTokenizer((FileTokenizer *)&start);
  FileTokenizer::init((FileTokenizer *)&start,(EVP_PKEY_CTX *)local_2f0);
  start_00 = Tokenizer::getPosition((Tokenizer *)&start);
  do {
    bVar1 = Tokenizer::atEnd((Tokenizer *)&start);
    bVar4 = false;
    if (!bVar1) {
      pTVar2 = Tokenizer::peekToken((Tokenizer *)&start,0);
      bVar4 = pTVar2->type != Separator;
    }
    if (!bVar4) {
      tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)Tokenizer::getPosition((Tokenizer *)&start);
      Tokenizer::getTokens
                ((vector<Token,_std::allocator<Token>_> *)local_470,(Tokenizer *)&start,start_00,
                 (TokenizerPosition)
                 tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      referenceIndex = Tokenizer::addEquValue((vector<Token,_std::allocator<Token>_> *)local_470);
      __end1 = std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::begin
                         (&this->entries);
      entry = (FileEntry *)
              std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::end
                        (&this->entries);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Parser::FileEntry_*,_std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>_>
                                         *)&entry), bVar4) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<Parser::FileEntry_*,_std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>_>
                 ::operator*(&__end1);
        Tokenizer::resetLookaheadCheckMarks(pFVar3->tokenizer);
        __gnu_cxx::
        __normal_iterator<Parser::FileEntry_*,_std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>_>
        ::operator++(&__end1);
      }
      SymbolTable::addEquation
                (&Global.symbolTable,name,Global.FileInfo.FileNum,Global.Section,referenceIndex);
      std::vector<Token,_std::allocator<Token>_>::~vector
                ((vector<Token,_std::allocator<Token>_> *)local_470);
      goto LAB_00183857;
    }
    pTVar2 = Tokenizer::nextToken((Tokenizer *)&start);
    if (pTVar2->type == Identifier) {
      this_00 = Token::identifierValue(pTVar2);
      bVar4 = Identifier::operator==(this_00,name);
      if (bVar4) {
        printError<Identifier>
                  (this,startToken,"Recursive equ definition for \"%s\" not allowed",name);
        goto LAB_00183857;
      }
    }
  } while (pTVar2->type != Equ);
  printError<>(this,startToken,"equ value must not contain another equ instance");
LAB_00183857:
  FileTokenizer::~FileTokenizer((FileTokenizer *)&start);
  TextFile::~TextFile((TextFile *)local_2f0);
  return;
}

Assistant:

void Parser::addEquation(const Token& startToken, const Identifier& name, const std::string& value)
{
	// parse value string
	TextFile f;
	f.openMemory(value);

	FileTokenizer tok;
	tok.init(&f);

	TokenizerPosition start = tok.getPosition();
	while (!tok.atEnd() && tok.peekToken().type != TokenType::Separator)
	{
		const Token& token = tok.nextToken();
		if (token.type == TokenType::Identifier && token.identifierValue() == name)
		{
			printError(startToken, "Recursive equ definition for \"%s\" not allowed",name);
			return;
		}

		if (token.type == TokenType::Equ)
		{
			printError(startToken, "equ value must not contain another equ instance");
			return;
		}
	}

	// extract tokens
	TokenizerPosition end = tok.getPosition();
	std::vector<Token> tokens = tok.getTokens(start, end);
	size_t index = Tokenizer::addEquValue(tokens);

	for (FileEntry& entry : entries)
		entry.tokenizer->resetLookaheadCheckMarks();

	// register equation
	Global.symbolTable.addEquation(name, Global.FileInfo.FileNum, Global.Section, index);
}